

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

int skip_whitespace(istream *is)

{
  int iVar1;
  bool bVar2;
  int local_14;
  int c;
  istream *is_local;
  
  while( true ) {
    local_14 = std::istream::peek();
    while( true ) {
      bVar2 = false;
      if (local_14 != -1) {
        iVar1 = isspace(local_14);
        bVar2 = iVar1 != 0;
      }
      if (!bVar2) break;
      std::istream::get();
      local_14 = std::istream::peek();
    }
    if (local_14 != 0x3b) break;
    while (local_14 != -1 && local_14 != 10) {
      local_14 = std::istream::get();
    }
  }
  return local_14;
}

Assistant:

static int skip_whitespace(std::istream &is)
{
    int c;
    while(true)
    {
        c = is.peek();
        while(c != EOF && isspace(c))
        {
            is.get();
            c = is.peek();
        }
        if(c == ';')
        {
            while(c != EOF && c != '\n')
            {
                c = is.get();
            }
        }
        else
            return c;
    }
}